

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_trange.c
# Opt level: O1

ErrorNumber test_func_trange(TA_History *history)

{
  TA_RetCode TVar1;
  ErrorNumber EVar2;
  ulong uVar3;
  ulong uVar4;
  char *pcVar5;
  TA_Test_conflict16 *pTVar6;
  TA_Integer outNbElement;
  TA_Integer outBegIdx;
  TA_Test_conflict16 *local_50;
  TA_Real *local_48;
  TA_Real *pTStack_40;
  TA_Real *local_38;
  
  pTVar6 = tableTest;
  uVar3 = 0;
  do {
    if ((int)history->nbBars < pTVar6->expectedNbElement) {
      pcVar5 = "TA_ATR";
      if (pTVar6->doAverage == 0) {
        pcVar5 = "TA_TRANGE";
      }
      printf("%s Failed Bad Parameter for Test #%d (%d,%d)\n",pcVar5,uVar3 & 0xffffffff);
      return TA_TESTUTIL_TFRR_BAD_PARAM;
    }
    clearAllBuffers();
    setInputBuffer(0,history->high,history->nbBars);
    setInputBuffer(1,history->low,history->nbBars);
    setInputBuffer(2,history->close,history->nbBars);
    if (pTVar6->doAverage == 0) {
      TVar1 = TA_TRANGE(pTVar6->startIdx,pTVar6->endIdx,gBuffer[0].in,gBuffer[1].in,gBuffer[2].in,
                        &outBegIdx,&outNbElement,gBuffer[0].out0);
    }
    else {
      TA_SetUnstablePeriod(TA_FUNC_UNST_ATR,pTVar6->unstablePeriod);
      TVar1 = TA_ATR(pTVar6->startIdx,pTVar6->endIdx,gBuffer[0].in,gBuffer[1].in,gBuffer[2].in,
                     pTVar6->optInTimePeriod,&outBegIdx,&outNbElement,gBuffer[0].out0);
    }
    EVar2 = checkDataSame(gBuffer[0].in,history->high,history->nbBars);
    if ((((EVar2 == TA_TEST_PASS) &&
         (EVar2 = checkDataSame(gBuffer[1].in,history->low,history->nbBars), EVar2 == TA_TEST_PASS))
        && (EVar2 = checkDataSame(gBuffer[2].in,history->close,history->nbBars),
           EVar2 == TA_TEST_PASS)) &&
       (EVar2 = checkExpectedValue(gBuffer[0].out0,TVar1,pTVar6->expectedRetCode,outBegIdx,
                                   pTVar6->expectedBegIdx,outNbElement,pTVar6->expectedNbElement,
                                   pTVar6->oneOfTheExpectedOutReal,
                                   pTVar6->oneOfTheExpectedOutRealIndex), EVar2 == TA_TEST_PASS)) {
      outNbElement = 0;
      outBegIdx = 0;
      if (pTVar6->doAverage == 0) {
        TVar1 = TA_TRANGE(pTVar6->startIdx,pTVar6->endIdx,gBuffer[0].in,gBuffer[1].in,gBuffer[2].in,
                          &outBegIdx,&outNbElement,gBuffer[0].in);
      }
      else {
        TA_SetUnstablePeriod(TA_FUNC_UNST_ATR,pTVar6->unstablePeriod);
        TVar1 = TA_ATR(pTVar6->startIdx,pTVar6->endIdx,gBuffer[0].in,gBuffer[1].in,gBuffer[2].in,
                       pTVar6->optInTimePeriod,&outBegIdx,&outNbElement,gBuffer[0].in);
      }
      EVar2 = checkSameContent(gBuffer[0].out0,gBuffer[0].in);
      if ((EVar2 != TA_TEST_PASS) ||
         (EVar2 = checkExpectedValue(gBuffer[0].in,TVar1,pTVar6->expectedRetCode,outBegIdx,
                                     pTVar6->expectedBegIdx,outNbElement,pTVar6->expectedNbElement,
                                     pTVar6->oneOfTheExpectedOutReal,
                                     pTVar6->oneOfTheExpectedOutRealIndex), EVar2 != TA_TEST_PASS))
      goto LAB_0011c2ea;
      local_48 = history->high;
      pTStack_40 = history->low;
      local_38 = history->close;
      local_50 = pTVar6;
      if ((pTVar6->doRangeTestFlag != 0) &&
         (EVar2 = doRangeTest(rangeTestFunction,TA_FUNC_UNST_ATR,&local_50,1,0),
         EVar2 != TA_TEST_PASS)) goto LAB_0011c2ea;
      uVar4 = 0;
    }
    else {
LAB_0011c2ea:
      uVar4 = (ulong)EVar2;
    }
    if ((ErrorNumber)uVar4 != TA_TEST_PASS) {
      pcVar5 = "TA_ATR";
      if (pTVar6->doAverage == 0) {
        pcVar5 = "TA_TRANGE";
      }
      printf("%s Failed Test #%d (Code=%d)\n",pcVar5,uVar3 & 0xffffffff,uVar4);
      return (ErrorNumber)uVar4;
    }
    uVar3 = uVar3 + 1;
    pTVar6 = pTVar6 + 1;
    if (uVar3 == 0x11) {
      return TA_TEST_PASS;
    }
  } while( true );
}

Assistant:

ErrorNumber test_func_trange( TA_History *history )
{
   unsigned int i;
   ErrorNumber retValue;

   for( i=0; i < NB_TEST; i++ )
   {
      if( (int)tableTest[i].expectedNbElement > (int)history->nbBars )
      {
         printf( "%s Failed Bad Parameter for Test #%d (%d,%d)\n",
                 tableTest[i].doAverage? "TA_ATR":"TA_TRANGE",
                 i, tableTest[i].expectedNbElement, history->nbBars );
         return TA_TESTUTIL_TFRR_BAD_PARAM;
      }

      retValue = do_test( history, &tableTest[i] );
      if( retValue != 0 )
      {
         printf( "%s Failed Test #%d (Code=%d)\n",
                 tableTest[i].doAverage? "TA_ATR":"TA_TRANGE",
                 i, retValue );
         return retValue;
      }
   }


   /* All test succeed. */
   return TA_TEST_PASS;
}